

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O1

vector3f tinyusdz::vcross(vector3f *a,vector3f *b)

{
  vector3f vVar1;
  
  vVar1.x = a->y * b->z - b->y * a->z;
  vVar1.y = a->z * b->x - b->z * a->x;
  vVar1.z = a->x * b->y - b->x * a->y;
  return vVar1;
}

Assistant:

float operator[](size_t idx) const { return *(&x + idx); }